

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void highbd_dr_prediction_z1_32xN_avx2
               (int N,uint16_t *dst,ptrdiff_t stride,uint16_t *above,int upsample_above,int dx,
               int bd)

{
  long lVar1;
  undefined8 *puVar2;
  uint16_t uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  ushort uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint uVar10;
  uint uVar11;
  undefined1 (*pauVar12) [32];
  long lVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [32];
  uint16_t *puVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  ushort uVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar45 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  __m256i dstvec [128];
  undefined8 local_1060 [518];
  undefined1 auVar27 [32];
  
  lVar20 = (long)N;
  lVar13 = lVar20 + 0x1f;
  uVar3 = above[lVar20 + 0x1f];
  auVar26._2_2_ = uVar3;
  auVar26._0_2_ = uVar3;
  auVar26._4_2_ = uVar3;
  auVar26._6_2_ = uVar3;
  auVar26._8_2_ = uVar3;
  auVar26._10_2_ = uVar3;
  auVar26._12_2_ = uVar3;
  auVar26._14_2_ = uVar3;
  auVar27._16_2_ = uVar3;
  auVar27._0_16_ = auVar26;
  auVar27._18_2_ = uVar3;
  auVar27._20_2_ = uVar3;
  auVar27._22_2_ = uVar3;
  auVar27._24_2_ = uVar3;
  auVar27._26_2_ = uVar3;
  auVar27._28_2_ = uVar3;
  auVar27._30_2_ = uVar3;
  iVar21 = (int)lVar13;
  auVar29._0_2_ = (undefined2)lVar13;
  auVar29._2_2_ = auVar29._0_2_;
  auVar29._4_2_ = auVar29._0_2_;
  auVar29._6_2_ = auVar29._0_2_;
  auVar29._8_2_ = auVar29._0_2_;
  auVar29._10_2_ = auVar29._0_2_;
  auVar29._12_2_ = auVar29._0_2_;
  auVar29._14_2_ = auVar29._0_2_;
  auVar29._16_2_ = auVar29._0_2_;
  auVar29._18_2_ = auVar29._0_2_;
  auVar29._20_2_ = auVar29._0_2_;
  auVar29._22_2_ = auVar29._0_2_;
  auVar29._24_2_ = auVar29._0_2_;
  auVar29._26_2_ = auVar29._0_2_;
  auVar29._28_2_ = auVar29._0_2_;
  auVar29._30_2_ = auVar29._0_2_;
  auVar28 = auVar27._16_16_;
  if (dx < 0xc) {
    uVar19 = 0;
    uVar25 = 0;
    if (0 < N) {
      uVar25 = (ulong)(uint)N;
    }
    uVar17 = (ulong)(uint)N;
    pauVar15 = (undefined1 (*) [32])local_1060;
    auVar35._8_2_ = 0x10;
    auVar35._0_8_ = 0x10001000100010;
    auVar35._10_2_ = 0x10;
    auVar35._12_2_ = 0x10;
    auVar35._14_2_ = 0x10;
    auVar35._16_2_ = 0x10;
    auVar35._18_2_ = 0x10;
    auVar35._20_2_ = 0x10;
    auVar35._22_2_ = 0x10;
    auVar35._24_2_ = 0x10;
    auVar35._26_2_ = 0x10;
    auVar35._28_2_ = 0x10;
    auVar35._30_2_ = 0x10;
    auVar4 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
    uVar18 = upsample_above;
    do {
      if (uVar19 == uVar25) break;
      iVar22 = (int)uVar18 >> 6;
      uVar14 = uVar17;
      pauVar12 = pauVar15;
      if (iVar22 < iVar21) {
        uVar6 = (ushort)(uVar18 >> 1);
        uVar30 = uVar6 & 0x1f;
        auVar31._0_8_ = CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
        auVar31._8_2_ = uVar30;
        auVar31._10_2_ = uVar30;
        auVar31._12_2_ = uVar30;
        auVar31._14_2_ = uVar30;
        auVar31._16_2_ = uVar30;
        auVar31._18_2_ = uVar30;
        auVar31._20_2_ = uVar30;
        auVar31._22_2_ = uVar30;
        auVar31._24_2_ = uVar30;
        auVar31._26_2_ = uVar30;
        auVar31._28_2_ = uVar30;
        auVar31._30_2_ = uVar30;
        lVar20 = (long)iVar22;
        for (uVar14 = 0; uVar14 < 0x20; uVar14 = uVar14 + 0x10) {
          auVar33 = auVar27;
          if ((long)(lVar20 + uVar14) < lVar13) {
            auVar33 = vpsubw_avx2(*(undefined1 (*) [32])(above + lVar20 + uVar14 + 1),
                                  *(undefined1 (*) [32])(above + lVar20 + uVar14));
            auVar34 = vpmullw_avx2(auVar33,auVar31);
            auVar33 = vpsllw_avx2(*(undefined1 (*) [32])(above + lVar20 + uVar14),5);
            auVar33 = vpaddw_avx2(auVar33,auVar35);
            auVar33 = vpaddw_avx2(auVar34,auVar33);
            auVar34 = vpsrlw_avx2(auVar33,5);
            iVar5 = (int)uVar14;
            auVar41._0_2_ = (undefined2)(iVar22 + iVar5);
            auVar41._2_2_ = auVar41._0_2_;
            auVar41._4_2_ = auVar41._0_2_;
            auVar41._6_2_ = auVar41._0_2_;
            auVar41._8_2_ = auVar41._0_2_;
            auVar41._10_2_ = auVar41._0_2_;
            auVar41._12_2_ = auVar41._0_2_;
            auVar41._14_2_ = auVar41._0_2_;
            auVar41 = vpaddw_avx(auVar41,auVar4);
            auVar44 = vpslldq_avx(auVar41,2);
            auVar44 = vpblendw_avx(auVar44,ZEXT416((uint)(iVar22 + iVar5)),1);
            auVar41 = vpsrldq_avx(auVar41,0xe);
            auVar42._0_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar26;
            auVar42._16_16_ = ZEXT116(0) * auVar28 + ZEXT116(1) * auVar41;
            auVar46._0_2_ = (undefined2)(iVar22 + 9 + iVar5);
            auVar46._2_2_ = auVar46._0_2_;
            auVar46._4_2_ = auVar46._0_2_;
            auVar46._6_2_ = auVar46._0_2_;
            auVar46._8_2_ = auVar46._0_2_;
            auVar46._10_2_ = auVar46._0_2_;
            auVar46._12_2_ = auVar46._0_2_;
            auVar46._14_2_ = auVar46._0_2_;
            auVar46._16_2_ = auVar46._0_2_;
            auVar46._18_2_ = auVar46._0_2_;
            auVar46._20_2_ = auVar46._0_2_;
            auVar46._22_2_ = auVar46._0_2_;
            auVar46._24_2_ = auVar46._0_2_;
            auVar46._26_2_ = auVar46._0_2_;
            auVar46._28_2_ = auVar46._0_2_;
            auVar46._30_2_ = auVar46._0_2_;
            auVar33 = vpblendw_avx2(auVar42,auVar46,2);
            auVar47._0_2_ = (undefined2)(iVar22 + 10 + iVar5);
            auVar47._2_2_ = auVar47._0_2_;
            auVar47._4_2_ = auVar47._0_2_;
            auVar47._6_2_ = auVar47._0_2_;
            auVar47._8_2_ = auVar47._0_2_;
            auVar47._10_2_ = auVar47._0_2_;
            auVar47._12_2_ = auVar47._0_2_;
            auVar47._14_2_ = auVar47._0_2_;
            auVar47._16_2_ = auVar47._0_2_;
            auVar47._18_2_ = auVar47._0_2_;
            auVar47._20_2_ = auVar47._0_2_;
            auVar47._22_2_ = auVar47._0_2_;
            auVar47._24_2_ = auVar47._0_2_;
            auVar47._26_2_ = auVar47._0_2_;
            auVar47._28_2_ = auVar47._0_2_;
            auVar47._30_2_ = auVar47._0_2_;
            auVar33 = vpblendw_avx2(auVar33,auVar47,4);
            auVar48._0_2_ = (undefined2)(iVar22 + 0xb + iVar5);
            auVar48._2_2_ = auVar48._0_2_;
            auVar48._4_2_ = auVar48._0_2_;
            auVar48._6_2_ = auVar48._0_2_;
            auVar48._8_2_ = auVar48._0_2_;
            auVar48._10_2_ = auVar48._0_2_;
            auVar48._12_2_ = auVar48._0_2_;
            auVar48._14_2_ = auVar48._0_2_;
            auVar48._16_2_ = auVar48._0_2_;
            auVar48._18_2_ = auVar48._0_2_;
            auVar48._20_2_ = auVar48._0_2_;
            auVar48._22_2_ = auVar48._0_2_;
            auVar48._24_2_ = auVar48._0_2_;
            auVar48._26_2_ = auVar48._0_2_;
            auVar48._28_2_ = auVar48._0_2_;
            auVar48._30_2_ = auVar48._0_2_;
            auVar33 = vpblendw_avx2(auVar33,auVar48,8);
            auVar49._0_2_ = (undefined2)(iVar22 + 0xc + iVar5);
            auVar49._2_2_ = auVar49._0_2_;
            auVar49._4_2_ = auVar49._0_2_;
            auVar49._6_2_ = auVar49._0_2_;
            auVar49._8_2_ = auVar49._0_2_;
            auVar49._10_2_ = auVar49._0_2_;
            auVar49._12_2_ = auVar49._0_2_;
            auVar49._14_2_ = auVar49._0_2_;
            auVar49._16_2_ = auVar49._0_2_;
            auVar49._18_2_ = auVar49._0_2_;
            auVar49._20_2_ = auVar49._0_2_;
            auVar49._22_2_ = auVar49._0_2_;
            auVar49._24_2_ = auVar49._0_2_;
            auVar49._26_2_ = auVar49._0_2_;
            auVar49._28_2_ = auVar49._0_2_;
            auVar49._30_2_ = auVar49._0_2_;
            auVar33 = vpblendw_avx2(auVar33,auVar49,0x10);
            auVar50._0_2_ = (undefined2)(iVar22 + 0xd + iVar5);
            auVar50._2_2_ = auVar50._0_2_;
            auVar50._4_2_ = auVar50._0_2_;
            auVar50._6_2_ = auVar50._0_2_;
            auVar50._8_2_ = auVar50._0_2_;
            auVar50._10_2_ = auVar50._0_2_;
            auVar50._12_2_ = auVar50._0_2_;
            auVar50._14_2_ = auVar50._0_2_;
            auVar50._16_2_ = auVar50._0_2_;
            auVar50._18_2_ = auVar50._0_2_;
            auVar50._20_2_ = auVar50._0_2_;
            auVar50._22_2_ = auVar50._0_2_;
            auVar50._24_2_ = auVar50._0_2_;
            auVar50._26_2_ = auVar50._0_2_;
            auVar50._28_2_ = auVar50._0_2_;
            auVar50._30_2_ = auVar50._0_2_;
            auVar33 = vpblendw_avx2(auVar33,auVar50,0x20);
            auVar51._0_2_ = (undefined2)(iVar22 + 0xe + iVar5);
            auVar51._2_2_ = auVar51._0_2_;
            auVar51._4_2_ = auVar51._0_2_;
            auVar51._6_2_ = auVar51._0_2_;
            auVar51._8_2_ = auVar51._0_2_;
            auVar51._10_2_ = auVar51._0_2_;
            auVar51._12_2_ = auVar51._0_2_;
            auVar51._14_2_ = auVar51._0_2_;
            auVar51._16_2_ = auVar51._0_2_;
            auVar51._18_2_ = auVar51._0_2_;
            auVar51._20_2_ = auVar51._0_2_;
            auVar51._22_2_ = auVar51._0_2_;
            auVar51._24_2_ = auVar51._0_2_;
            auVar51._26_2_ = auVar51._0_2_;
            auVar51._28_2_ = auVar51._0_2_;
            auVar51._30_2_ = auVar51._0_2_;
            auVar33 = vpblendw_avx2(auVar33,auVar51,0x40);
            auVar52._0_2_ = (undefined2)(iVar22 + 0xf + iVar5);
            auVar52._2_2_ = auVar52._0_2_;
            auVar52._4_2_ = auVar52._0_2_;
            auVar52._6_2_ = auVar52._0_2_;
            auVar52._8_2_ = auVar52._0_2_;
            auVar52._10_2_ = auVar52._0_2_;
            auVar52._12_2_ = auVar52._0_2_;
            auVar52._14_2_ = auVar52._0_2_;
            auVar52._16_2_ = auVar52._0_2_;
            auVar52._18_2_ = auVar52._0_2_;
            auVar52._20_2_ = auVar52._0_2_;
            auVar52._22_2_ = auVar52._0_2_;
            auVar52._24_2_ = auVar52._0_2_;
            auVar52._26_2_ = auVar52._0_2_;
            auVar52._28_2_ = auVar52._0_2_;
            auVar52._30_2_ = auVar52._0_2_;
            auVar33 = vpblendw_avx2(auVar33,auVar52,0x80);
            auVar33 = vpblendd_avx2(ZEXT1632(auVar44),auVar33,0xf0);
            auVar33 = vpcmpgtw_avx2(auVar29,auVar33);
            auVar33 = vpblendvb_avx2(auVar27,auVar34,auVar33);
          }
          lVar24 = (long)N;
          if (uVar14 == 0) {
            lVar24 = 0;
          }
          *(undefined1 (*) [32])(local_1060 + uVar19 * 4 + lVar24 * 4) = auVar33;
        }
        uVar18 = uVar18 + upsample_above;
      }
      else {
        while (uVar14 != 0) {
          *pauVar12 = auVar27;
          pauVar12[N] = auVar27;
          uVar14 = uVar14 - 1;
          pauVar12 = pauVar12 + 1;
        }
      }
      uVar19 = uVar19 + 1;
      pauVar15 = pauVar15 + 1;
      uVar17 = uVar17 - 1;
    } while (iVar22 < iVar21);
  }
  else {
    uVar19 = 0;
    uVar25 = (ulong)(uint)N;
    if (N < 1) {
      uVar25 = uVar19;
    }
    uVar17 = (ulong)(uint)N;
    pauVar15 = (undefined1 (*) [32])local_1060;
    auVar33._8_4_ = 0x10;
    auVar33._0_8_ = 0x1000000010;
    auVar33._12_4_ = 0x10;
    auVar33._16_4_ = 0x10;
    auVar33._20_4_ = 0x10;
    auVar33._24_4_ = 0x10;
    auVar33._28_4_ = 0x10;
    auVar4 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
    uVar18 = upsample_above;
    do {
      if (uVar19 == uVar25) break;
      uVar23 = (int)uVar18 >> 6;
      uVar14 = uVar17;
      pauVar12 = pauVar15;
      if ((int)uVar23 < iVar21) {
        uVar10 = uVar18 >> 1;
        uVar11 = uVar10 & 0x1f801f;
        auVar34._0_8_ = CONCAT44(uVar10,uVar10) & 0x1f801f001f801f;
        auVar34._8_4_ = uVar11;
        auVar34._12_4_ = uVar11;
        auVar34._16_4_ = uVar11;
        auVar34._20_4_ = uVar11;
        auVar34._24_4_ = uVar11;
        auVar34._28_4_ = uVar11;
        lVar24 = (long)(int)uVar23;
        auVar35 = auVar27;
        if (lVar24 < lVar13) {
          auVar41 = auVar26;
          if (8 < (ulong)(lVar13 - lVar24)) {
            auVar35 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar24 + 8));
            auVar38 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar24 + 9));
            auVar38 = vpsubd_avx2(auVar38,auVar35);
            auVar35 = vpslld_avx2(auVar35,5);
            auVar38 = vpmulld_avx2(auVar38,auVar34);
            auVar35 = vpaddd_avx2(auVar35,auVar33);
            auVar35 = vpaddd_avx2(auVar38,auVar35);
            auVar35 = vpsrld_avx2(auVar35,5);
            auVar38._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar35._16_16_;
            auVar38._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar26;
            auVar35 = vpackusdw_avx2(auVar35,auVar38);
            auVar41 = auVar35._0_16_;
          }
          auVar35 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar24));
          auVar38 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar24 + 1));
          auVar38 = vpsubd_avx2(auVar38,auVar35);
          auVar35 = vpslld_avx2(auVar35,5);
          auVar38 = vpmulld_avx2(auVar38,auVar34);
          auVar35 = vpaddd_avx2(auVar35,auVar33);
          auVar35 = vpaddd_avx2(auVar38,auVar35);
          auVar35 = vpsrld_avx2(auVar35,5);
          auVar35 = vpackusdw_avx2(auVar35,ZEXT1632(auVar35._16_16_));
          auVar45._0_2_ = (short)uVar23;
          auVar45._2_2_ = auVar45._0_2_;
          auVar45._4_2_ = auVar45._0_2_;
          auVar45._6_2_ = auVar45._0_2_;
          auVar45._8_2_ = auVar45._0_2_;
          auVar45._10_2_ = auVar45._0_2_;
          auVar45._12_2_ = auVar45._0_2_;
          auVar45._14_2_ = auVar45._0_2_;
          auVar44 = vpaddw_avx(auVar45,auVar4);
          auVar64._0_2_ = auVar45._0_2_ + 0xd;
          auVar65._0_2_ = auVar45._0_2_ + 0xe;
          auVar66._0_2_ = auVar45._0_2_ + 0xf;
          auVar45 = vpslldq_avx(auVar44,2);
          auVar45 = vpblendw_avx(auVar45,ZEXT416(uVar23),1);
          auVar44 = vpsrldq_avx(auVar44,0xe);
          auVar43._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar26;
          auVar43._16_16_ = ZEXT116(0) * auVar28 + ZEXT116(1) * auVar44;
          auVar60._0_2_ = (undefined2)(uVar23 + 9);
          auVar60._2_2_ = auVar60._0_2_;
          auVar60._4_2_ = auVar60._0_2_;
          auVar60._6_2_ = auVar60._0_2_;
          auVar60._8_2_ = auVar60._0_2_;
          auVar60._10_2_ = auVar60._0_2_;
          auVar60._12_2_ = auVar60._0_2_;
          auVar60._14_2_ = auVar60._0_2_;
          auVar60._16_2_ = auVar60._0_2_;
          auVar60._18_2_ = auVar60._0_2_;
          auVar60._20_2_ = auVar60._0_2_;
          auVar60._22_2_ = auVar60._0_2_;
          auVar60._24_2_ = auVar60._0_2_;
          auVar60._26_2_ = auVar60._0_2_;
          auVar60._28_2_ = auVar60._0_2_;
          auVar60._30_2_ = auVar60._0_2_;
          auVar38 = vpblendw_avx2(auVar43,auVar60,2);
          auVar61._0_2_ = (undefined2)(uVar23 + 10);
          auVar61._2_2_ = auVar61._0_2_;
          auVar61._4_2_ = auVar61._0_2_;
          auVar61._6_2_ = auVar61._0_2_;
          auVar61._8_2_ = auVar61._0_2_;
          auVar61._10_2_ = auVar61._0_2_;
          auVar61._12_2_ = auVar61._0_2_;
          auVar61._14_2_ = auVar61._0_2_;
          auVar61._16_2_ = auVar61._0_2_;
          auVar61._18_2_ = auVar61._0_2_;
          auVar61._20_2_ = auVar61._0_2_;
          auVar61._22_2_ = auVar61._0_2_;
          auVar61._24_2_ = auVar61._0_2_;
          auVar61._26_2_ = auVar61._0_2_;
          auVar61._28_2_ = auVar61._0_2_;
          auVar61._30_2_ = auVar61._0_2_;
          auVar38 = vpblendw_avx2(auVar38,auVar61,4);
          auVar62._0_2_ = (undefined2)(uVar23 + 0xb);
          auVar62._2_2_ = auVar62._0_2_;
          auVar62._4_2_ = auVar62._0_2_;
          auVar62._6_2_ = auVar62._0_2_;
          auVar62._8_2_ = auVar62._0_2_;
          auVar62._10_2_ = auVar62._0_2_;
          auVar62._12_2_ = auVar62._0_2_;
          auVar62._14_2_ = auVar62._0_2_;
          auVar62._16_2_ = auVar62._0_2_;
          auVar62._18_2_ = auVar62._0_2_;
          auVar62._20_2_ = auVar62._0_2_;
          auVar62._22_2_ = auVar62._0_2_;
          auVar62._24_2_ = auVar62._0_2_;
          auVar62._26_2_ = auVar62._0_2_;
          auVar62._28_2_ = auVar62._0_2_;
          auVar62._30_2_ = auVar62._0_2_;
          auVar38 = vpblendw_avx2(auVar38,auVar62,8);
          auVar63._0_2_ = (undefined2)(uVar23 + 0xc);
          auVar63._2_2_ = auVar63._0_2_;
          auVar63._4_2_ = auVar63._0_2_;
          auVar63._6_2_ = auVar63._0_2_;
          auVar63._8_2_ = auVar63._0_2_;
          auVar63._10_2_ = auVar63._0_2_;
          auVar63._12_2_ = auVar63._0_2_;
          auVar63._14_2_ = auVar63._0_2_;
          auVar63._16_2_ = auVar63._0_2_;
          auVar63._18_2_ = auVar63._0_2_;
          auVar63._20_2_ = auVar63._0_2_;
          auVar63._22_2_ = auVar63._0_2_;
          auVar63._24_2_ = auVar63._0_2_;
          auVar63._26_2_ = auVar63._0_2_;
          auVar63._28_2_ = auVar63._0_2_;
          auVar63._30_2_ = auVar63._0_2_;
          auVar38 = vpblendw_avx2(auVar38,auVar63,0x10);
          auVar64._2_2_ = auVar64._0_2_;
          auVar64._4_2_ = auVar64._0_2_;
          auVar64._6_2_ = auVar64._0_2_;
          auVar64._8_2_ = auVar64._0_2_;
          auVar64._10_2_ = auVar64._0_2_;
          auVar64._12_2_ = auVar64._0_2_;
          auVar64._14_2_ = auVar64._0_2_;
          auVar64._16_2_ = auVar64._0_2_;
          auVar64._18_2_ = auVar64._0_2_;
          auVar64._20_2_ = auVar64._0_2_;
          auVar64._22_2_ = auVar64._0_2_;
          auVar64._24_2_ = auVar64._0_2_;
          auVar64._26_2_ = auVar64._0_2_;
          auVar64._28_2_ = auVar64._0_2_;
          auVar64._30_2_ = auVar64._0_2_;
          auVar38 = vpblendw_avx2(auVar38,auVar64,0x20);
          auVar65._2_2_ = auVar65._0_2_;
          auVar65._4_2_ = auVar65._0_2_;
          auVar65._6_2_ = auVar65._0_2_;
          auVar65._8_2_ = auVar65._0_2_;
          auVar65._10_2_ = auVar65._0_2_;
          auVar65._12_2_ = auVar65._0_2_;
          auVar65._14_2_ = auVar65._0_2_;
          auVar65._16_2_ = auVar65._0_2_;
          auVar65._18_2_ = auVar65._0_2_;
          auVar65._20_2_ = auVar65._0_2_;
          auVar65._22_2_ = auVar65._0_2_;
          auVar65._24_2_ = auVar65._0_2_;
          auVar65._26_2_ = auVar65._0_2_;
          auVar65._28_2_ = auVar65._0_2_;
          auVar65._30_2_ = auVar65._0_2_;
          auVar38 = vpblendw_avx2(auVar38,auVar65,0x40);
          auVar66._2_2_ = auVar66._0_2_;
          auVar66._4_2_ = auVar66._0_2_;
          auVar66._6_2_ = auVar66._0_2_;
          auVar66._8_2_ = auVar66._0_2_;
          auVar66._10_2_ = auVar66._0_2_;
          auVar66._12_2_ = auVar66._0_2_;
          auVar66._14_2_ = auVar66._0_2_;
          auVar66._16_2_ = auVar66._0_2_;
          auVar66._18_2_ = auVar66._0_2_;
          auVar66._20_2_ = auVar66._0_2_;
          auVar66._22_2_ = auVar66._0_2_;
          auVar66._24_2_ = auVar66._0_2_;
          auVar66._26_2_ = auVar66._0_2_;
          auVar66._28_2_ = auVar66._0_2_;
          auVar66._30_2_ = auVar66._0_2_;
          auVar38 = vpblendw_avx2(auVar38,auVar66,0x80);
          auVar38 = vpblendd_avx2(ZEXT1632(auVar45),auVar38,0xf0);
          auVar38 = vpcmpgtw_avx2(auVar29,auVar38);
          auVar36._0_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar35._0_16_;
          auVar36._16_16_ = ZEXT116(0) * auVar35._16_16_ + ZEXT116(1) * auVar41;
          auVar35 = vpblendvb_avx2(auVar27,auVar36,auVar38);
        }
        *(undefined1 (*) [32])(local_1060 + uVar19 * 4) = auVar35;
        lVar1 = lVar24 + 0x10;
        auVar35 = auVar27;
        if (lVar1 < lVar13) {
          auVar41 = auVar26;
          if (8 < (ulong)(lVar13 - lVar1)) {
            auVar35 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar24 + 0x18));
            auVar38 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar24 + 0x19));
            auVar38 = vpsubd_avx2(auVar38,auVar35);
            auVar35 = vpslld_avx2(auVar35,5);
            auVar38 = vpmulld_avx2(auVar38,auVar34);
            auVar35 = vpaddd_avx2(auVar35,auVar33);
            auVar35 = vpaddd_avx2(auVar38,auVar35);
            auVar35 = vpsrld_avx2(auVar35,5);
            auVar39._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar35._16_16_;
            auVar39._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar26;
            auVar35 = vpackusdw_avx2(auVar35,auVar39);
            auVar41 = auVar35._0_16_;
          }
          auVar35 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar24 + 0x10));
          auVar38 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar24 + 0x11));
          auVar38 = vpsubd_avx2(auVar38,auVar35);
          auVar35 = vpslld_avx2(auVar35,5);
          auVar34 = vpmulld_avx2(auVar38,auVar34);
          auVar35 = vpaddd_avx2(auVar35,auVar33);
          auVar35 = vpaddd_avx2(auVar34,auVar35);
          auVar35 = vpsrld_avx2(auVar35,5);
          auVar35 = vpackusdw_avx2(auVar35,ZEXT1632(auVar35._16_16_));
          uVar10 = (uint)lVar1;
          auVar37._0_2_ = (short)lVar1;
          auVar37._2_2_ = auVar37._0_2_;
          auVar37._4_2_ = auVar37._0_2_;
          auVar37._6_2_ = auVar37._0_2_;
          auVar37._8_2_ = auVar37._0_2_;
          auVar37._10_2_ = auVar37._0_2_;
          auVar37._12_2_ = auVar37._0_2_;
          auVar37._14_2_ = auVar37._0_2_;
          auVar44 = vpaddw_avx(auVar37,auVar4);
          auVar56._0_2_ = auVar37._0_2_ + 0xc;
          auVar57._0_2_ = auVar37._0_2_ + 0xd;
          auVar58._0_2_ = auVar37._0_2_ + 0xe;
          auVar45 = vpslldq_avx(auVar44,2);
          auVar45 = vpblendw_avx(auVar45,ZEXT416(uVar10),1);
          auVar44 = vpsrldq_avx(auVar44,0xe);
          auVar40._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar26;
          auVar40._16_16_ = ZEXT116(0) * auVar28 + ZEXT116(1) * auVar44;
          auVar53._0_2_ = (undefined2)(uVar10 + 9);
          auVar53._2_2_ = auVar53._0_2_;
          auVar53._4_2_ = auVar53._0_2_;
          auVar53._6_2_ = auVar53._0_2_;
          auVar53._8_2_ = auVar53._0_2_;
          auVar53._10_2_ = auVar53._0_2_;
          auVar53._12_2_ = auVar53._0_2_;
          auVar53._14_2_ = auVar53._0_2_;
          auVar53._16_2_ = auVar53._0_2_;
          auVar53._18_2_ = auVar53._0_2_;
          auVar53._20_2_ = auVar53._0_2_;
          auVar53._22_2_ = auVar53._0_2_;
          auVar53._24_2_ = auVar53._0_2_;
          auVar53._26_2_ = auVar53._0_2_;
          auVar53._28_2_ = auVar53._0_2_;
          auVar53._30_2_ = auVar53._0_2_;
          auVar34 = vpblendw_avx2(auVar40,auVar53,2);
          auVar54._0_2_ = (undefined2)(uVar10 + 10);
          auVar54._2_2_ = auVar54._0_2_;
          auVar54._4_2_ = auVar54._0_2_;
          auVar54._6_2_ = auVar54._0_2_;
          auVar54._8_2_ = auVar54._0_2_;
          auVar54._10_2_ = auVar54._0_2_;
          auVar54._12_2_ = auVar54._0_2_;
          auVar54._14_2_ = auVar54._0_2_;
          auVar54._16_2_ = auVar54._0_2_;
          auVar54._18_2_ = auVar54._0_2_;
          auVar54._20_2_ = auVar54._0_2_;
          auVar54._22_2_ = auVar54._0_2_;
          auVar54._24_2_ = auVar54._0_2_;
          auVar54._26_2_ = auVar54._0_2_;
          auVar54._28_2_ = auVar54._0_2_;
          auVar54._30_2_ = auVar54._0_2_;
          auVar34 = vpblendw_avx2(auVar34,auVar54,4);
          auVar55._0_2_ = (undefined2)(uVar10 + 0xb);
          auVar55._2_2_ = auVar55._0_2_;
          auVar55._4_2_ = auVar55._0_2_;
          auVar55._6_2_ = auVar55._0_2_;
          auVar55._8_2_ = auVar55._0_2_;
          auVar55._10_2_ = auVar55._0_2_;
          auVar55._12_2_ = auVar55._0_2_;
          auVar55._14_2_ = auVar55._0_2_;
          auVar55._16_2_ = auVar55._0_2_;
          auVar55._18_2_ = auVar55._0_2_;
          auVar55._20_2_ = auVar55._0_2_;
          auVar55._22_2_ = auVar55._0_2_;
          auVar55._24_2_ = auVar55._0_2_;
          auVar55._26_2_ = auVar55._0_2_;
          auVar55._28_2_ = auVar55._0_2_;
          auVar55._30_2_ = auVar55._0_2_;
          auVar34 = vpblendw_avx2(auVar34,auVar55,8);
          auVar56._2_2_ = auVar56._0_2_;
          auVar56._4_2_ = auVar56._0_2_;
          auVar56._6_2_ = auVar56._0_2_;
          auVar56._8_2_ = auVar56._0_2_;
          auVar56._10_2_ = auVar56._0_2_;
          auVar56._12_2_ = auVar56._0_2_;
          auVar56._14_2_ = auVar56._0_2_;
          auVar56._16_2_ = auVar56._0_2_;
          auVar56._18_2_ = auVar56._0_2_;
          auVar56._20_2_ = auVar56._0_2_;
          auVar56._22_2_ = auVar56._0_2_;
          auVar56._24_2_ = auVar56._0_2_;
          auVar56._26_2_ = auVar56._0_2_;
          auVar56._28_2_ = auVar56._0_2_;
          auVar56._30_2_ = auVar56._0_2_;
          auVar34 = vpblendw_avx2(auVar34,auVar56,0x10);
          auVar57._2_2_ = auVar57._0_2_;
          auVar57._4_2_ = auVar57._0_2_;
          auVar57._6_2_ = auVar57._0_2_;
          auVar57._8_2_ = auVar57._0_2_;
          auVar57._10_2_ = auVar57._0_2_;
          auVar57._12_2_ = auVar57._0_2_;
          auVar57._14_2_ = auVar57._0_2_;
          auVar57._16_2_ = auVar57._0_2_;
          auVar57._18_2_ = auVar57._0_2_;
          auVar57._20_2_ = auVar57._0_2_;
          auVar57._22_2_ = auVar57._0_2_;
          auVar57._24_2_ = auVar57._0_2_;
          auVar57._26_2_ = auVar57._0_2_;
          auVar57._28_2_ = auVar57._0_2_;
          auVar57._30_2_ = auVar57._0_2_;
          auVar34 = vpblendw_avx2(auVar34,auVar57,0x20);
          auVar58._2_2_ = auVar58._0_2_;
          auVar58._4_2_ = auVar58._0_2_;
          auVar58._6_2_ = auVar58._0_2_;
          auVar58._8_2_ = auVar58._0_2_;
          auVar58._10_2_ = auVar58._0_2_;
          auVar58._12_2_ = auVar58._0_2_;
          auVar58._14_2_ = auVar58._0_2_;
          auVar58._16_2_ = auVar58._0_2_;
          auVar58._18_2_ = auVar58._0_2_;
          auVar58._20_2_ = auVar58._0_2_;
          auVar58._22_2_ = auVar58._0_2_;
          auVar58._24_2_ = auVar58._0_2_;
          auVar58._26_2_ = auVar58._0_2_;
          auVar58._28_2_ = auVar58._0_2_;
          auVar58._30_2_ = auVar58._0_2_;
          auVar34 = vpblendw_avx2(auVar34,auVar58,0x40);
          auVar59._0_2_ = (undefined2)(uVar10 + 0xf);
          auVar59._2_2_ = auVar59._0_2_;
          auVar59._4_2_ = auVar59._0_2_;
          auVar59._6_2_ = auVar59._0_2_;
          auVar59._8_2_ = auVar59._0_2_;
          auVar59._10_2_ = auVar59._0_2_;
          auVar59._12_2_ = auVar59._0_2_;
          auVar59._14_2_ = auVar59._0_2_;
          auVar59._16_2_ = auVar59._0_2_;
          auVar59._18_2_ = auVar59._0_2_;
          auVar59._20_2_ = auVar59._0_2_;
          auVar59._22_2_ = auVar59._0_2_;
          auVar59._24_2_ = auVar59._0_2_;
          auVar59._26_2_ = auVar59._0_2_;
          auVar59._28_2_ = auVar59._0_2_;
          auVar59._30_2_ = auVar59._0_2_;
          auVar34 = vpblendw_avx2(auVar34,auVar59,0x80);
          auVar34 = vpblendd_avx2(ZEXT1632(auVar45),auVar34,0xf0);
          auVar34 = vpcmpgtw_avx2(auVar29,auVar34);
          auVar32._0_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar35._0_16_;
          auVar32._16_16_ = ZEXT116(0) * auVar35._16_16_ + ZEXT116(1) * auVar41;
          auVar35 = vpblendvb_avx2(auVar27,auVar32,auVar34);
        }
        *(undefined1 (*) [32])(local_1060 + lVar20 * 4 + uVar19 * 4) = auVar35;
        uVar18 = uVar18 + upsample_above;
      }
      else {
        while (uVar14 != 0) {
          *pauVar12 = auVar27;
          pauVar12[lVar20] = auVar27;
          uVar14 = uVar14 - 1;
          pauVar12 = pauVar12 + 1;
        }
      }
      uVar19 = uVar19 + 1;
      pauVar15 = pauVar15 + 1;
      uVar17 = uVar17 - 1;
    } while ((int)uVar23 < iVar21);
  }
  puVar16 = dst + 0x10;
  for (lVar13 = 0; uVar25 * 0x20 != lVar13; lVar13 = lVar13 + 0x20) {
    uVar7 = *(undefined8 *)((long)local_1060 + lVar13 + 8);
    uVar8 = *(undefined8 *)((long)local_1060 + lVar13 + 0x10);
    uVar9 = *(undefined8 *)((long)local_1060 + lVar13 + 0x18);
    *(undefined8 *)(puVar16 + -0x10) = *(undefined8 *)((long)local_1060 + lVar13);
    *(undefined8 *)(puVar16 + -0xc) = uVar7;
    *(undefined8 *)(puVar16 + -8) = uVar8;
    *(undefined8 *)(puVar16 + -4) = uVar9;
    puVar2 = (undefined8 *)((long)local_1060 + lVar13 + (long)N * 0x20);
    uVar7 = puVar2[1];
    uVar8 = puVar2[2];
    uVar9 = puVar2[3];
    *(undefined8 *)puVar16 = *puVar2;
    *(undefined8 *)(puVar16 + 4) = uVar7;
    *(undefined8 *)(puVar16 + 8) = uVar8;
    *(undefined8 *)(puVar16 + 0xc) = uVar9;
    puVar16 = puVar16 + stride;
  }
  return;
}

Assistant:

static void highbd_dr_prediction_z1_32xN_avx2(int N, uint16_t *dst,
                                              ptrdiff_t stride,
                                              const uint16_t *above,
                                              int upsample_above, int dx,
                                              int bd) {
  __m256i dstvec[128];
  if (bd < 12) {
    highbd_dr_prediction_z1_32xN_internal_avx2(N, dstvec, above, upsample_above,
                                               dx);
  } else {
    highbd_dr_prediction_32bit_z1_32xN_internal_avx2(N, dstvec, above,
                                                     upsample_above, dx);
  }
  for (int i = 0; i < N; i++) {
    _mm256_storeu_si256((__m256i *)(dst + stride * i), dstvec[i]);
    _mm256_storeu_si256((__m256i *)(dst + stride * i + 16), dstvec[i + N]);
  }
}